

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCopier.cxx
# Opt level: O3

MatchProperties __thiscall cmFileCopier::CollectMatchProperties(cmFileCopier *this,string *file)

{
  pointer pMVar1;
  bool bVar2;
  bool bVar3;
  pointer pMVar4;
  pointer this_00;
  ulong uVar5;
  byte bVar6;
  
  this_00 = (this->MatchRules).
            super__Vector_base<cmFileCopier::MatchRule,_std::allocator<cmFileCopier::MatchRule>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pMVar1 = (this->MatchRules).
           super__Vector_base<cmFileCopier::MatchRule,_std::allocator<cmFileCopier::MatchRule>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  uVar5 = 0;
  if (this_00 == pMVar1) {
    bVar6 = 0;
LAB_004152d5:
    if (this->MatchlessFiles == false) {
      bVar3 = cmsys::SystemTools::FileIsDirectory(file);
      bVar6 = !bVar3;
    }
  }
  else {
    bVar3 = false;
    bVar6 = 0;
    do {
      while( true ) {
        pMVar4 = this_00 + 1;
        bVar2 = cmsys::RegularExpression::find
                          (&this_00->Regex,(file->_M_dataplus)._M_p,
                           (RegularExpressionMatch *)this_00);
        if (bVar2) break;
        this_00 = pMVar4;
        if (pMVar4 == pMVar1) {
          uVar5 = uVar5 << 0x20;
          if (bVar3) goto LAB_004152ea;
          goto LAB_004152d5;
        }
      }
      bVar6 = bVar6 | (this_00->Properties).Exclude;
      uVar5 = (ulong)((uint)uVar5 | (this_00->Properties).Permissions);
      bVar3 = true;
      this_00 = pMVar4;
    } while (pMVar4 != pMVar1);
    uVar5 = uVar5 << 0x20;
  }
LAB_004152ea:
  return (MatchProperties)(bVar6 | uVar5);
}

Assistant:

cmFileCopier::MatchProperties cmFileCopier::CollectMatchProperties(
  const std::string& file)
{
  // Match rules are case-insensitive on some platforms.
#if defined(_WIN32) || defined(__APPLE__) || defined(__CYGWIN__)
  const std::string file_to_match = cmSystemTools::LowerCase(file);
#else
  const std::string& file_to_match = file;
#endif

  // Collect properties from all matching rules.
  bool matched = false;
  MatchProperties result;
  for (MatchRule& mr : this->MatchRules) {
    if (mr.Regex.find(file_to_match)) {
      matched = true;
      result.Exclude |= mr.Properties.Exclude;
      result.Permissions |= mr.Properties.Permissions;
    }
  }
  if (!matched && !this->MatchlessFiles) {
    result.Exclude = !cmSystemTools::FileIsDirectory(file);
  }
  return result;
}